

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_primary(void)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  _func_int **len;
  CTcTokenizer *this;
  undefined1 uVar5;
  tc_toktyp_t tVar6;
  CTPNInlineObject *pCVar7;
  CTcToken *pCVar8;
  CVmHashEntry *this_00;
  CTPNAnonFunc *pCVar9;
  undefined **ppuVar10;
  CTcPrsNode *pCVar11;
  CTcPrsNode *pCVar12;
  undefined *puVar13;
  CTcSymFunc *this_01;
  uint32_t addr;
  int is_method;
  int iVar14;
  uint *puVar15;
  bool bVar16;
  CTcConstVal cval;
  CTcToken tok2;
  CTcEmbedBuilderSgl builder;
  CTcToken tok;
  
  uVar5 = cval._32_1_;
  cval.typ_ = TC_CVT_UNK;
  cval._32_1_ = cval._32_1_ & 0xfe;
  puVar15 = &switchD_00233e37::switchdataD_002f962c;
  while (this = G_tok, tVar6 = (G_tok->curtok_).typ_, (int)tVar6 < 0x5c) {
    iVar14 = 0x2b13;
    switch(tVar6) {
    case TOKT_SYM:
      pCVar12 = CTcParser::create_sym_node(G_prs,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_);
      CTcTokenizer::next(G_tok);
      return pCVar12;
    case TOKT_INT:
      goto switchD_00233e37_caseD_9;
    case TOKT_SSTR_START:
      ppuVar10 = &PTR_is_double_0035bee0;
      goto LAB_002344c8;
    case TOKT_SSTR_MID:
    case TOKT_SSTR_END:
    case TOKT_COMMA:
    case TOKT_DOT:
    case TOKT_EQ:
    case TOKT_EQEQ:
    case TOKT_ASI:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_TIMES:
    case TOKT_DIV:
    case TOKT_MOD:
    case TOKT_GT:
    case TOKT_LT:
    case TOKT_GE:
    case TOKT_LE:
    case TOKT_NE:
    case TOKT_ARROW:
    case TOKT_COLON:
      goto switchD_00233e37_caseD_c;
    case TOKT_DSTR:
      if ((G_prs->field_0xec & 1) == 0) {
        G_prs->self_referenced_ = 1;
        pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
        pp_Var4 = (_func_int **)(G_tok->curtok_).text_;
        len = (_func_int **)(G_tok->curtok_).text_len_;
        (pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
             (_func_int **)&PTR___cxa_pure_virtual_00358e80;
        pCVar12[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var4;
        pCVar12[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = len;
        CTcGenTarg::note_str(G_cg,(size_t)len);
        (pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00362cf0;
        goto LAB_0023445b;
      }
    case TOKT_SSTR:
      CTcConstVal::set_sstr(&cval,&G_tok->curtok_);
      goto LAB_00234688;
    case TOKT_DSTR_START:
      G_prs->self_referenced_ = 1;
      ppuVar10 = &PTR_is_double_0035be68;
LAB_002344c8:
      builder.super_CTcEmbedBuilder._vptr_CTcEmbedBuilder =
           (CTcEmbedBuilder)(CTcEmbedBuilder)ppuVar10;
      pCVar12 = parse_embedding(&builder.super_CTcEmbedBuilder);
      return pCVar12;
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RBRACE:
    case TOKT_SEM:
      CTcTokenizer::log_error_curtok(G_tok,0x2b15);
      cval.val_.intval_ = (G_tok->curtok_).int_val_;
      cval.typ_ = TC_CVT_INT;
      goto LAB_00234690;
    case TOKT_RESTR:
      cval.typ_ = TC_CVT_RESTR;
      cval.val_.intval_ = (long)(G_tok->curtok_).text_;
      cval.val_.floatval_.len_ = (G_tok->curtok_).text_len_;
      cval.val_.strval_.pool_ofs_ = 0;
      goto LAB_00234688;
    case TOKT_LPAR:
      CTcTokenizer::next(G_tok);
      pCVar12 = CTcPrsOpBin::parse(&S_op_comma.super_CTcPrsOpBin);
      if (pCVar12 == (CTcPrsNode *)0x0) {
        return (CTcPrsNode *)0x0;
      }
      if ((G_tok->curtok_).typ_ != TOKT_RPAR) {
        CTcTokenizer::log_error_curtok(G_tok,0x2b04);
        return pCVar12;
      }
LAB_0023445b:
      CTcTokenizer::next(G_tok);
      return pCVar12;
    case TOKT_RPAR:
      goto switchD_00233e37_caseD_14;
    case TOKT_LBRACE:
      iVar14 = 1;
      goto LAB_00234379;
    case TOKT_LBRACK:
      pCVar12 = parse_list();
      return pCVar12;
    case TOKT_RBRACK:
      iVar14 = 0x2b14;
switchD_00233e37_caseD_14:
      CTcTokenizer::log_error(iVar14);
      CTcTokenizer::next(G_tok);
      break;
    default:
      switch(tVar6) {
      case TOKT_POUND:
        pCVar8 = CTcTokenizer::copycur(G_tok);
        tok._32_1_ = pCVar8->field_0x20;
        tok.typ_ = pCVar8->typ_;
        tok._4_4_ = *(undefined4 *)&pCVar8->field_0x4;
        tok.text_ = pCVar8->text_;
        tok.text_len_ = pCVar8->text_len_;
        tok.int_val_ = pCVar8->int_val_;
        if (((G_prs->field_0xec & 8) != 0) && (tVar6 = CTcTokenizer::next(G_tok), tVar6 == TOKT_SYM)
           ) {
          pCVar8 = CTcTokenizer::copycur(G_tok);
          tok2.typ_ = pCVar8->typ_;
          tok2._4_4_ = *(undefined4 *)&pCVar8->field_0x4;
          tok2.text_ = pCVar8->text_;
          tok2.text_len_ = pCVar8->text_len_;
          tok2.int_val_ = pCVar8->int_val_;
          tok2._32_1_ = pCVar8->field_0x20;
          if ((((tok2.text_len_ == 5) &&
               ((*(char *)((long)tok2.text_ + 4) == 'j' && (int)*(long *)tok2.text_ == 0x626f5f5f ||
                (*(char *)((long)tok2.text_ + 4) == 'j' && (int)*(long *)tok2.text_ == 0x626f5f5f)))
               ) || ((tok2.text_len_ == 6 &&
                     ((((*(short *)((long)tok2.text_ + 4) == 0x706f &&
                         (int)*(long *)tok2.text_ == 0x72705f5f ||
                        (*(short *)((long)tok2.text_ + 4) == 0x7274 &&
                         (int)*(long *)tok2.text_ == 0x73735f5f)) ||
                       (*(short *)((long)tok2.text_ + 4) == 0x7473 &&
                        (int)*(long *)tok2.text_ == 0x696c5f5f)) ||
                      ((*(short *)((long)tok2.text_ + 4) == 0x636e &&
                        (int)*(long *)tok2.text_ == 0x75665f5f ||
                       (*(short *)((long)tok2.text_ + 4) == 0x6d75 &&
                        (int)*(long *)tok2.text_ == 0x6e655f5f)))))))) ||
             ((tok2.text_len_ == 8 && (*(long *)tok2.text_ == 0x7274706669625f5f)))) {
            tVar6 = CTcTokenizer::next(G_tok);
            if (tVar6 == TOKT_INT) {
              uVar2 = (G_tok->curtok_).int_val_;
              CTcTokenizer::next(G_tok);
              if ((tok2.text_len_ == 5) &&
                 (tok2.text_[4] == 'j' && *(int *)tok2.text_ == 0x626f5f5f)) {
                cval.typ_ = TC_CVT_OBJ;
                cval.val_.listval_.pool_ofs_ = 0xffffffff;
                cval.val_.enumval_ = uVar2;
LAB_00234750:
                puVar15 = (uint *)CTcPrsMem::alloc(G_prsmem,0x30);
                (((CTcPrsNode *)puVar15)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
                     (_func_int **)&PTR___cxa_pure_virtual_00359a70;
                *(undefined4 *)
                 &(((CTcPrsNode *)((long)puVar15 + 8))->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
                     0;
                *(byte *)&(((CTcPrsNode *)((long)puVar15 + 0x28))->super_CTcPrsNodeBase).
                          _vptr_CTcPrsNodeBase =
                     *(byte *)&(((CTcPrsNode *)((long)puVar15 + 0x28))->super_CTcPrsNodeBase).
                               _vptr_CTcPrsNodeBase & 0xfe;
                (((CTcPrsNode *)((long)puVar15 + 8))->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
                     (_func_int **)CONCAT44(cval._4_4_,cval.typ_);
                (((CTcPrsNode *)((long)puVar15 + 0x10))->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                     = (_func_int **)cval.val_.intval_;
                *(undefined1 *)
                 &(((CTcPrsNode *)((long)puVar15 + 0x28))->super_CTcPrsNodeBase).
                  _vptr_CTcPrsNodeBase = cval._32_1_;
                (((CTcPrsNode *)((long)puVar15 + 0x18))->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                     = (_func_int **)cval.val_.floatval_.len_;
                (((CTcPrsNode *)((long)puVar15 + 0x20))->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                     = (_func_int **)CONCAT44(cval.val_._20_4_,cval.val_.strval_.pool_ofs_);
                (((CTcPrsNode *)puVar15)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
                     (_func_int **)&PTR_gen_code_0035f7b0;
                bVar16 = false;
              }
              else {
                if (tok2.text_len_ == 6) {
                  addr = (uint32_t)uVar2;
                  if (*(short *)(tok2.text_ + 4) == 0x706f && *(int *)tok2.text_ == 0x72705f5f) {
                    cval.typ_ = TC_CVT_PROP;
                    cval.val_.propval_ = addr;
                  }
                  else if (*(short *)(tok2.text_ + 4) == 0x7274 && *(int *)tok2.text_ == 0x73735f5f)
                  {
                    cval.typ_ = TC_CVT_SSTR;
                    cval.val_.intval_ = 0;
                    cval.val_.floatval_.len_ = 0;
                    cval.val_.strval_.pool_ofs_ = addr;
                  }
                  else if (*(short *)(tok2.text_ + 4) == 0x7473 && *(int *)tok2.text_ == 0x696c5f5f)
                  {
                    cval.typ_ = TC_CVT_LIST;
                    cval.val_.intval_ = 0;
                    cval.val_.listval_.pool_ofs_ = addr;
                  }
                  else if (*(short *)(tok2.text_ + 4) == 0x636e && *(int *)tok2.text_ == 0x75665f5f)
                  {
                    this_01 = (CTcSymFunc *)CTcPrsMem::alloc(G_prsmem,0x98);
                    CTcSymFuncBase::CTcSymFuncBase
                              ((CTcSymFuncBase *)this_01,".anon",5,0,0,0,0,0,0,0,0,1);
                    (this_01->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                    super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
                         (_func_int **)&PTR__CTcSymFuncBase_003633b8;
                    this_01->field_0x90 = this_01->field_0x90 & 0xfe;
                    this_01->abs_addr_ = 0;
                    CTcSymFunc::set_abs_addr(this_01,addr);
                    cval.typ_ = TC_CVT_FUNCPTR;
                    cval.val_.funcptrval_ = this_01;
                  }
                  else {
                    if (*(short *)(tok2.text_ + 4) != 0x6d75 || *(int *)tok2.text_ != 0x6e655f5f)
                    goto LAB_0023414b;
                    cval.typ_ = TC_CVT_ENUM;
                    cval.val_.enumval_ = uVar2;
                  }
                  goto LAB_00234750;
                }
LAB_0023414b:
                bVar16 = true;
                if ((tok2.text_len_ == 8) && (*(long *)tok2.text_ == 0x7274706669625f5f)) {
                  uVar3 = (G_tok->curtok_).int_val_;
                  CTcTokenizer::next(G_tok);
                  this_00 = (CVmHashEntry *)CTcPrsMem::alloc(G_prsmem,0x38);
                  CVmHashEntry::CVmHashEntry(this_00,".anon",5,0);
                  *(undefined4 *)&this_00->field_0x24 = 6;
                  *(short *)&this_00[1]._vptr_CVmHashEntry = (short)uVar2;
                  *(short *)((long)&this_00[1]._vptr_CVmHashEntry + 2) = (short)uVar3;
                  *(undefined8 *)((long)&this_00[1]._vptr_CVmHashEntry + 4) = 0;
                  pbVar1 = (byte *)((long)&this_00[1].nxt_ + 4);
                  *pbVar1 = *pbVar1 & 0xfc;
                  this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00363da0;
                  cval.typ_ = TC_CVT_BIFPTR;
                  cval.val_.listval_.l_ = (CTPNList *)this_00;
                  goto LAB_00234750;
                }
              }
              if (!bVar16) {
                return (CTcPrsNode *)puVar15;
              }
              goto switchD_00233e37_caseD_c;
            }
            CTcTokenizer::unget(G_tok,&tok2);
          }
        }
        CTcTokenizer::unget(G_tok,&tok);
        goto switchD_00233e37_caseD_c;
      default:
        goto switchD_00233e37_caseD_c;
      case TOKT_FLOAT:
        cval.val_.intval_ = (long)(G_tok->curtok_).text_;
        cval.val_.floatval_.len_ = (G_tok->curtok_).text_len_;
        cval._32_1_ = uVar5 & 0xfc;
        break;
      case TOKT_BIGINT:
        cval.val_.intval_ = (long)(G_tok->curtok_).text_;
        cval.val_.floatval_.len_ = (G_tok->curtok_).text_len_;
        cval._32_1_ = uVar5 & 0xfc | 2;
        break;
      case TOKT_SELF:
        G_prs->self_referenced_ = 1;
        CTcTokenizer::next(this);
        pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
        puVar13 = &CTPNSelf::vtable;
        goto LAB_002346e1;
      case TOKT_INHERITED:
        pCVar12 = parse_inherited();
        return pCVar12;
      case TOKT_ARGCOUNT:
        CTcTokenizer::next(G_tok);
        pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
        puVar13 = &CTPNArgc::vtable;
        goto LAB_002346e1;
      }
      cval.typ_ = TC_CVT_FLOAT;
      goto LAB_00234688;
    }
  }
  switch(tVar6) {
  case TOKT_DELEGATED:
    pCVar12 = parse_delegated();
    return pCVar12;
  case TOKT_TARGETPROP:
    G_prs->full_method_ctx_referenced_ = 1;
    CTcTokenizer::next(this);
    pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
    puVar13 = &CTPNTargetprop::vtable;
    break;
  case TOKT_PROPERTYSET:
  case TOKT_TRANSIENT:
  case TOKT_PROPERTY:
  case TOKT_OPERATOR:
    goto switchD_00233e37_caseD_c;
  case TOKT_TARGETOBJ:
    G_prs->full_method_ctx_referenced_ = 1;
    CTcTokenizer::next(this);
    pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
    puVar13 = &CTPNTargetobj::vtable;
    break;
  case TOKT_DEFININGOBJ:
    G_prs->full_method_ctx_referenced_ = 1;
    CTcTokenizer::next(this);
    pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
    puVar13 = &CTPNDefiningobj::vtable;
    break;
  case TOKT_REPLACED:
    CTcTokenizer::next(G_tok);
    pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
    puVar13 = &CTPNReplaced::vtable;
    break;
  case TOKT_METHOD:
switchD_00233e65_caseD_80:
    iVar14 = 0;
    is_method = 1;
    goto LAB_0023437b;
  case TOKT_INVOKEE:
    CTcTokenizer::next(G_tok);
    pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
    puVar13 = &CTPNInvokee::vtable;
    break;
  default:
    switch(tVar6) {
    case TOKT_FUNCTION:
switchD_00233e95_caseD_5c:
      iVar14 = 0;
LAB_00234379:
      is_method = 0;
LAB_0023437b:
      pCVar9 = parse_anon_func(iVar14,is_method);
      return (CTcPrsNode *)pCVar9;
    case TOKT_OBJECT:
      pCVar7 = parse_inline_object(0);
      return (CTcPrsNode *)pCVar7;
    case TOKT_NIL:
      cval.typ_ = TC_CVT_NIL;
      break;
    case TOKT_TRUE:
      cval.typ_ = TC_CVT_TRUE;
      break;
    default:
      if (tVar6 == TOKT_NEW) {
        tVar6 = CTcTokenizer::next(G_tok);
        if (tVar6 == TOKT_METHOD) goto switchD_00233e65_caseD_80;
        if (tVar6 != TOKT_FUNCTION) {
          bVar16 = (G_tok->curtok_).typ_ == TOKT_TRANSIENT;
          if (bVar16) {
            CTcTokenizer::next(G_tok);
          }
          pCVar12 = parse_primary();
          if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
            pCVar12 = parse_call(pCVar12);
          }
          pCVar11 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
          pCVar11[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar12;
          (pCVar11->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
               (_func_int **)&PTR_gen_code_003601f0;
          *(uint *)&pCVar11[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (uint)bVar16;
          return pCVar11;
        }
        goto switchD_00233e95_caseD_5c;
      }
    case TOKT_RETURN:
    case TOKT_LOCAL:
switchD_00233e37_caseD_c:
      CTcTokenizer::log_error_curtok(G_tok,0x2b05);
      CTcTokenizer::next(G_tok);
switchD_00233e37_caseD_9:
      cval.val_.intval_ = (G_tok->curtok_).int_val_;
      cval.typ_ = TC_CVT_INT;
    }
LAB_00234688:
    CTcTokenizer::next(G_tok);
LAB_00234690:
    pCVar12 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
    (pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR___cxa_pure_virtual_00359a70;
    *(undefined4 *)&pCVar12[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
    *(byte *)&pCVar12[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         *(byte *)&pCVar12[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
    pCVar12[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)CONCAT44(cval._4_4_,cval.typ_);
    pCVar12[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cval.val_.intval_;
    *(undefined1 *)&pCVar12[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = cval._32_1_;
    pCVar12[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cval.val_.floatval_.len_;
    pCVar12[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)CONCAT44(cval.val_._20_4_,cval.val_.strval_.pool_ofs_);
    puVar13 = &CTPNConst::vtable;
  }
LAB_002346e1:
  (pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)(puVar13 + 0x10);
  return pCVar12;
}

Assistant:

vbignum_t *CTcPrsOpDiv::calc_result(
    const vbignum_t &a, const vbignum_t &b) const
{
    /* check for division by zero */
    if (b.is_zero())
    {
        /* log an error, and just return the left operand */
        G_tok->log_error(TCERR_CONST_DIV_ZERO);
        return new vbignum_t(1L);
    }
    else
    {
        /* calculate the result */
        return a / b;
    }
}